

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localize.h
# Opt level: O1

void __thiscall
wasm::ChildLocalizer::ChildLocalizer
          (ChildLocalizer *this,Expression *input,Function *func,Module *wasm,PassOptions *options)

{
  Expression **ppEVar1;
  Type TVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  Index index;
  pointer pppEVar5;
  ulong uVar6;
  Expression ***pppEVar7;
  pointer pppEVar8;
  Expression *pEVar9;
  byte bVar10;
  uint uVar11;
  EffectAnalyzer *this_00;
  Type type;
  int iVar12;
  pointer pppEVar13;
  undefined1 local_c0 [8];
  ChildIterator iterator;
  undefined1 auStack_68 [8];
  vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> effects;
  Builder builder;
  LocalSet *local_38;
  Expression *child;
  
  (this->sets).super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sets).super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sets).super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  type.id = (uintptr_t)options;
  effects.super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)wasm;
  AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
            ((AbstractChildIterator<wasm::ChildIterator> *)local_c0,input);
  auStack_68 = (undefined1  [8])0x0;
  effects.super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  effects.super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pppEVar13 = (pointer)(((long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                               flexible.
                               super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                               ._M_impl.super__Vector_impl_data._M_start -
                         (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                               fixed._M_elems[3] >> 3) + (long)local_c0);
  if (pppEVar13 != (pointer)0x0) {
    pppEVar5 = (pointer)0x0;
    pppEVar8 = (pointer)0x1;
    do {
      uVar6 = ~(ulong)pppEVar5 + (long)pppEVar13;
      pppEVar7 = (Expression ***)
                 (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems
                  [3] + (uVar6 - 4));
      if (uVar6 < 4) {
        pppEVar7 = iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems
                   + (uVar6 - 1);
      }
      local_38 = (LocalSet *)**pppEVar7;
      std::vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>>::
      emplace_back<wasm::PassOptions_const&,wasm::Module&,wasm::Expression*&>
                ((vector<wasm::EffectAnalyzer,std::allocator<wasm::EffectAnalyzer>> *)auStack_68,
                 options,wasm,(Expression **)&local_38);
      bVar4 = pppEVar8 < pppEVar13;
      pppEVar5 = pppEVar8;
      pppEVar8 = (pointer)(ulong)((int)pppEVar8 + 1);
    } while (bVar4);
    iVar12 = 0;
    pppEVar5 = (pointer)0x0;
    do {
      uVar6 = ~(ulong)pppEVar5 + (long)pppEVar13;
      pppEVar7 = (Expression ***)
                 (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems
                  [3] + (uVar6 - 4));
      if (uVar6 < 4) {
        pppEVar7 = iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems
                   + (uVar6 - 1);
      }
      ppEVar1 = *pppEVar7;
      pEVar9 = *ppEVar1;
      if ((pEVar9->type).id == 1) break;
      this_00 = (EffectAnalyzer *)((long)auStack_68 + pppEVar5 * 0x170);
      iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.flexible.
      super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = pppEVar5;
      bVar4 = EffectAnalyzer::hasNonTrapSideEffects(this_00);
      bVar10 = 1;
      if (!bVar4) {
        if (this_00->trap == true) {
          bVar10 = this_00->trapsNeverHappen ^ 1;
        }
        else {
          bVar10 = 0;
        }
      }
      if (bVar10 == 0) {
        uVar11 = 1;
        pppEVar8 = (pointer)0x0;
        do {
          if ((iVar12 + uVar11 != 1) &&
             (bVar4 = EffectAnalyzer::invalidates
                                ((EffectAnalyzer *)((long)auStack_68 + pppEVar5 * 0x170),
                                 (EffectAnalyzer *)((long)auStack_68 + pppEVar8 * 0x170)), bVar4))
          goto LAB_0071f128;
          pppEVar8 = (pointer)(ulong)uVar11;
          uVar11 = uVar11 + 1;
        } while (pppEVar8 < pppEVar13);
      }
      else {
LAB_0071f128:
        auVar3._8_8_ = 0;
        auVar3._0_8_ = (pEVar9->type).id;
        index = Builder::addVar((Builder *)func,(Function *)0x0,(Name)(auVar3 << 0x40),type);
        local_38 = Builder::makeLocalSet
                             ((Builder *)
                              &effects.
                               super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,index,pEVar9);
        std::vector<wasm::LocalSet*,std::allocator<wasm::LocalSet*>>::emplace_back<wasm::LocalSet*>
                  ((vector<wasm::LocalSet*,std::allocator<wasm::LocalSet*>> *)this,&local_38);
        TVar2.id = (pEVar9->type).id;
        pEVar9 = (Expression *)
                 MixedArena::allocSpace
                           ((MixedArena *)
                            &((effects.
                               super__Vector_base<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage)->delegateTargets)
                             ._M_t._M_impl.super__Rb_tree_header._M_header._M_left,0x18,8);
        pEVar9->_id = 8;
        pEVar9[1]._id = index;
        (pEVar9->type).id = TVar2.id;
        *ppEVar1 = pEVar9;
      }
      pppEVar5 = (pointer)(ulong)((int)iterator.super_AbstractChildIterator<wasm::ChildIterator>.
                                       children.flexible.
                                       super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
      iVar12 = iVar12 + -1;
    } while (pppEVar5 < pppEVar13);
  }
  std::vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_>::~vector
            ((vector<wasm::EffectAnalyzer,_std::allocator<wasm::EffectAnalyzer>_> *)auStack_68);
  if (iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed._M_elems[3] !=
      (Expression **)0x0) {
    operator_delete(iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                    _M_elems[3],
                    (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.
                          flexible.
                          super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)iterator.super_AbstractChildIterator<wasm::ChildIterator>.children.fixed.
                          _M_elems[3]);
  }
  return;
}

Assistant:

ChildLocalizer(Expression* input,
                 Function* func,
                 Module* wasm,
                 const PassOptions& options) {
    Builder builder(*wasm);
    ChildIterator iterator(input);
    auto& children = iterator.children;
    auto num = children.size();

    // Compute the effects of all children.
    std::vector<EffectAnalyzer> effects;
    for (Index i = 0; i < num; i++) {
      // The children are in reverse order in ChildIterator, but we want to
      // process them in the normal order.
      auto* child = *children[num - 1 - i];
      effects.emplace_back(options, *wasm, child);
    }

    // Go through the children and move to locals those that we need to.
    for (Index i = 0; i < num; i++) {
      auto** childp = children[num - 1 - i];
      auto* child = *childp;
      if (child->type == Type::unreachable) {
        break;
      }

      // Use a local if we need to. That is the case either if this has side
      // effects we can't remove, or if it interacts with other children.
      bool needLocal = effects[i].hasUnremovableSideEffects();
      if (!needLocal) {
        for (Index j = 0; j < num; j++) {
          if (j != i && effects[i].invalidates(effects[j])) {
            needLocal = true;
            break;
          }
        }
      }
      if (needLocal) {
        auto local = builder.addVar(func, child->type);
        sets.push_back(builder.makeLocalSet(local, child));
        *childp = builder.makeLocalGet(local, child->type);
      }
    }
  }